

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

Vector<float,_2> __thiscall
deqp::gles31::Functional::(anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
          (_anonymous_namespace_ *this,Vector<float,_2> (*values) [4],float xFactor,float yFactor)

{
  Vector<float,_2> *b;
  Vector<float,_2> VVar1;
  Vector<float,_2> local_50;
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  Vector<float,_2> local_30;
  
  if (1.0 <= xFactor + yFactor) {
    b = *values + 3;
    tcu::operator-(*values + 1,b);
    tcu::operator*(1.0 - xFactor,&local_40);
    tcu::operator+(b,&local_38);
    tcu::operator-(*values + 2,b);
    tcu::operator*(1.0 - yFactor,&local_50);
  }
  else {
    tcu::operator-(*values + 2,*values);
    tcu::operator*(xFactor,&local_40);
    tcu::operator+(*values,&local_38);
    tcu::operator-(*values + 1,*values);
    tcu::operator*(yFactor,&local_50);
  }
  VVar1 = tcu::operator+(&local_30,&local_48);
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

static inline T triQuadInterpolate (const T (&values)[4], float xFactor, float yFactor)
{
	if (xFactor + yFactor < 1.0f)
		return values[0] + (values[2]-values[0])*xFactor		+ (values[1]-values[0])*yFactor;
	else
		return values[3] + (values[1]-values[3])*(1.0f-xFactor)	+ (values[2]-values[3])*(1.0f-yFactor);
}